

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::disconnect(CommonCore *this)

{
  BrokerBase *this_00;
  GlobalFederateId federateID;
  pointer pcVar1;
  size_type sVar2;
  string_view message;
  string_view message_00;
  bool bVar3;
  string *__rhs;
  ulong uVar4;
  int iVar5;
  string_view name;
  string_view name_00;
  ActionMessage udisconnect;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined8 local_108;
  char *pcStack_100;
  size_t local_f8;
  char *pcStack_f0;
  ActionMessage local_e8;
  
  ActionMessage::ActionMessage(&local_e8,cmd_user_disconnect);
  this_00 = &this->super_BrokerBase;
  BrokerBase::addActionMessage(this_00,&local_e8);
  iVar5 = -1;
  uVar4 = 1;
  do {
    bVar3 = waitForDisconnect(this,(milliseconds)0xc8);
    if (bVar3) {
LAB_002f825b:
      ActionMessage::~ActionMessage(&local_e8);
      return;
    }
    federateID.gid = (this->super_BrokerBase).global_id._M_i.gid;
    pcVar1 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    sVar2 = (this->super_BrokerBase).identifier._M_string_length;
    __rhs = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
    std::operator+(&local_128,"waiting on disconnect: current state=",__rhs);
    local_f8 = local_128._M_string_length;
    pcStack_f0 = local_128._M_dataplus._M_p;
    message._M_str = local_128._M_dataplus._M_p;
    message._M_len = local_128._M_string_length;
    name._M_str = pcVar1;
    name._M_len = sVar2;
    BrokerBase::sendToLogger(this_00,federateID,3,name,message,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((uVar4 & 3) == 0) {
      if (((this->super_BrokerBase).mainLoopIsRunning._M_base._M_i & 1U) == 0) {
        local_108 = 0x53;
        pcStack_100 = 
        "main loop is stopped but have not received disconnect notice, assuming disconnected";
        message_00._M_str =
             "main loop is stopped but have not received disconnect notice, assuming disconnected";
        message_00._M_len = 0x53;
        name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (this_00,(GlobalFederateId)(this->super_BrokerBase).global_id._M_i.gid,3,name_00,
                   message_00,false);
        goto LAB_002f825b;
      }
      BrokerBase::addActionMessage(this_00,&local_e8);
    }
    if ((int)(uVar4 / 0xd) + (int)(uVar4 / 0xd) * 0xc + iVar5 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"waiting on disconnect ",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
    }
    iVar5 = iVar5 + -1;
    uVar4 = (ulong)((int)uVar4 + 1);
  } while( true );
}

Assistant:

void CommonCore::disconnect()
{
    const ActionMessage udisconnect(CMD_USER_DISCONNECT);
    addActionMessage(udisconnect);
    int cnt{0};
    while (!waitForDisconnect(std::chrono::milliseconds(200))) {
        ++cnt;
        LOG_WARNING(global_id.load(),
                    getIdentifier(),
                    "waiting on disconnect: current state=" + brokerStateName(getBrokerState()));
        if (cnt % 4 == 0) {
            if (!isRunning()) {
                LOG_WARNING(
                    global_id.load(),
                    getIdentifier(),
                    "main loop is stopped but have not received disconnect notice, assuming disconnected");
                return;
            }
            addActionMessage(udisconnect);
        }
        if (cnt % 13 == 0) {
            std::cerr << "waiting on disconnect " << std::endl;
        }
    }
}